

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O0

void __thiscall Iex_3_2::BaseExc::BaseExc(BaseExc *this,char *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  exception *in_RDI;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__BaseExc_00188610;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffef);
  if ((anonymous_namespace)::currentStackTracer_abi_cxx11_ == (code *)0x0) {
    std::__cxx11::string::string((string *)(in_RDI + 0x28));
  }
  else {
    (*(anonymous_namespace)::currentStackTracer_abi_cxx11_)((string *)(in_RDI + 0x28));
  }
  return;
}

Assistant:

BaseExc::BaseExc (const char* s)
    : _message (s ? s : "")
    , _stackTrace (currentStackTracer ? currentStackTracer () : std::string ())
{}